

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_types.cpp
# Opt level: O2

void __thiscall twitter::zipkin::thrift::Annotation::Annotation(Annotation *this,Annotation *other2)

{
  *(undefined ***)this = &PTR__Annotation_0029b888;
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  (this->value)._M_string_length = 0;
  (this->value).field_2._M_local_buf[0] = '\0';
  Endpoint::Endpoint(&this->host);
  this->__isset = (_Annotation__isset)((byte)this->__isset & 0xf8);
  this->timestamp = other2->timestamp;
  std::__cxx11::string::_M_assign((string *)&this->value);
  Endpoint::operator=(&this->host,&other2->host);
  this->__isset = other2->__isset;
  return;
}

Assistant:

Annotation::Annotation(const Annotation& other2) {
  timestamp = other2.timestamp;
  value = other2.value;
  host = other2.host;
  __isset = other2.__isset;
}